

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O2

void __thiscall nigel::IM_Operator::~IM_Operator(IM_Operator *this)

{
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<nigel::IM_Operator>)._M_weak_this.
              super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

virtual ~IM_Operator() {}